

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBuffer.c
# Opt level: O0

JlBuffer * JlBufferCreate(void)

{
  uint8_t *puVar1;
  JlBuffer *local_10;
  JlBuffer *newBuffer;
  
  local_10 = (JlBuffer *)WjTestLib_Calloc(0x18,1);
  if (local_10 != (JlBuffer *)0x0) {
    puVar1 = (uint8_t *)WjTestLib_Calloc(0x4000,1);
    local_10->Buffer = puVar1;
    if (local_10->Buffer == (uint8_t *)0x0) {
      WjTestLib_Free(local_10);
      local_10 = (JlBuffer *)0x0;
    }
    else {
      local_10->BufferAllocated = 0x4000;
      local_10->BufferUsed = 0;
    }
  }
  return local_10;
}

Assistant:

JlBuffer*
    JlBufferCreate
    (
        void
    )
{
    JlBuffer* newBuffer = JlNew( JlBuffer );
    if( NULL != newBuffer )
    {
        newBuffer->Buffer = JlAlloc( BUFFER_GROW_SIZE );
        if( NULL != newBuffer->Buffer )
        {
            newBuffer->BufferAllocated = BUFFER_GROW_SIZE;
            newBuffer->BufferUsed = 0;
        }
        else
        {
            JlFree( newBuffer );
            newBuffer = NULL;
        }
    }
    else
    {
        // Failed to allocate
    }

    return newBuffer;
}